

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void linsolve(double *vec,double *mat,int16_t n)

{
  double dVar1;
  short sVar2;
  short sVar3;
  double buf;
  double row_max_val;
  int16_t row_max_i;
  int16_t idx3;
  int16_t idx2;
  int16_t idx1;
  int16_t k;
  int16_t j;
  int16_t i;
  int16_t n_local;
  double *mat_local;
  double *vec_local;
  
  for (k = 0; (int)k < n + -1; k = k + 1) {
    row_max_i = k;
    row_max_val = ABS(mat[(short)(n * k + k)]);
    i = k;
    while (i = i + 1, i < n) {
      sVar2 = n * k + i;
      if (row_max_val < ABS(mat[sVar2])) {
        row_max_val = ABS(mat[sVar2]);
        row_max_i = i;
      }
    }
    if (row_max_i != k) {
      dVar1 = vec[k];
      vec[k] = vec[row_max_i];
      vec[row_max_i] = dVar1;
      for (j = k; j < n; j = j + 1) {
        sVar2 = n * j + k;
        sVar3 = n * j + row_max_i;
        dVar1 = mat[sVar2];
        mat[sVar2] = mat[sVar3];
        mat[sVar3] = dVar1;
      }
    }
    dVar1 = mat[(short)(n * k + k)];
    i = k;
    while (i = i + 1, i < n) {
      sVar2 = n * k + i;
      mat[sVar2] = mat[sVar2] * (1.0 / dVar1);
      j = k;
      while (j = j + 1, j < n) {
        sVar3 = n * j + i;
        mat[sVar3] = -mat[sVar2] * mat[(short)(n * j + k)] + mat[sVar3];
      }
      vec[i] = -mat[sVar2] * vec[k] + vec[i];
    }
  }
  for (i = n + -1; -1 < i; i = i + -1) {
    for (j = n + -1; i < j; j = j + -1) {
      vec[i] = -mat[(short)(n * j + i)] * vec[j] + vec[i];
    }
    vec[i] = vec[i] / mat[(short)(n * i + i)];
  }
  return;
}

Assistant:

inline void linsolve(double* vec, double* mat, const int16_t n) {
  int16_t i, j, k, idx1, idx2, idx3;
  int16_t row_max_i;
  double row_max_val, buf;

  for (k = 0; k < n - 1; k++) {
    // Find i such that maximize A[i][k]
    idx1 = n * k + k;

    row_max_i = k;
    row_max_val = fabs(mat[idx1]);
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      if (row_max_val < fabs(mat[idx1])) {
        row_max_val = fabs(mat[idx1]);
        row_max_i = i;
      }
    }

    // Swap rows
    if (row_max_i != k) {
      buf = vec[k];
      vec[k] = vec[row_max_i];
      vec[row_max_i] = buf;
      for (j = k; j < n; j++) {
        idx1 = n * j + k;
        idx2 = n * j + row_max_i;
        buf = mat[idx1];
        mat[idx1] = mat[idx2];
        mat[idx2] = buf;
      }
    }

    // Forward elimination
    idx1 = n * k + k;
    buf = 1.0 / mat[idx1];
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      mat[idx1] = mat[idx1] * buf;

      for (j = k + 1; j < n; j++) {
        idx2 = n * j + k;
        idx3 = n * j + i;
        mat[idx3] -= mat[idx1] * mat[idx2];
      }
      vec[i] -= mat[idx1] * vec[k];
    }
  }

  // Backward elimination
  for (i = n - 1; i >= 0; i--) {
    for (j = n - 1; j > i; j--) {
      idx1 = n * j + i;
      vec[i] -= mat[idx1] * vec[j];
    }
    idx1 = n * i + i;
    vec[i] /= mat[idx1];
  }
}